

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

ITracker * __thiscall
Catch::TestCaseTracking::ITracker::findChild(ITracker *this,NameAndLocationRef *nameAndLocation)

{
  unique_ptr<Catch::TestCaseTracking::ITracker> *puVar1;
  bool bVar2;
  ITracker *pIVar3;
  long lVar4;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it_00;
  NameAndLocationRef *local_38;
  
  __it_00._M_current =
       (this->m_children).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_children).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)puVar1 - (long)__it_00._M_current >> 5;
  local_38 = nameAndLocation;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                            *)&local_38,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar2) goto LAB_0015a9b7;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                            *)&local_38,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar2) goto LAB_0015a9b7;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                            *)&local_38,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar2) goto LAB_0015a9b7;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                            *)&local_38,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar2) goto LAB_0015a9b7;
      __it_00._M_current = __it_00._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)puVar1 - (long)__it_00._M_current >> 3;
  if (lVar4 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar4 != 2) {
      __it._M_current = puVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
                  ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                                *)&local_38,__it_00), __it._M_current = __it_00._M_current, bVar2))
      goto LAB_0015a9b7;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
            ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                          *)&local_38,__it);
    if (bVar2) goto LAB_0015a9b7;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
          ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                        *)&local_38,__it_00);
  __it._M_current = puVar1;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_0015a9b7:
  if (__it._M_current ==
      (this->m_children).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar3 = (ITracker *)0x0;
  }
  else {
    pIVar3 = (__it._M_current)->m_ptr;
  }
  return pIVar3;
}

Assistant:

ITracker* ITracker::findChild( NameAndLocationRef const& nameAndLocation ) {
        auto it = std::find_if(
            m_children.begin(),
            m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ) {
                auto const& tnameAndLoc = tracker->nameAndLocation();
                if ( tnameAndLoc.location.line !=
                     nameAndLocation.location.line ) {
                    return false;
                }
                return tnameAndLoc == nameAndLocation;
            } );
        return ( it != m_children.end() ) ? it->get() : nullptr;
    }